

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.cpp
# Opt level: O0

int duckdb_lz4::LZ4_decompress_safe_partial_usingDict
              (char *source,char *dest,int compressedSize,int targetOutputSize,int dstCapacity,
              char *dictStart,int dictSize)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  char *in_RSI;
  char *in_RDI;
  int in_R8D;
  long in_R9;
  char *unaff_retaddr;
  undefined4 in_stack_00000010;
  int compressedSize_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if ((int)dictStart == 0) {
    iVar1 = LZ4_decompress_safe_partial(in_RDI,in_RSI,in_EDX,in_ECX,in_R8D);
  }
  else {
    iVar1 = (int)((ulong)in_RSI >> 0x20);
    compressedSize_00 = (int)((ulong)in_RDI >> 0x20);
    if ((char *)(in_R9 + (int)dictStart) == in_RSI) {
      if ((int)dictStart < 0xffff) {
        iVar1 = LZ4_decompress_safe_partial_withSmallPrefix
                          (unaff_retaddr,
                           (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                           compressedSize_00,(int)in_RDI,iVar1,CONCAT44(in_EDX,in_ECX));
      }
      else {
        iVar1 = LZ4_decompress_safe_partial_withPrefix64k(in_RDI,in_RSI,in_EDX,in_ECX,in_R8D);
      }
    }
    else {
      iVar1 = LZ4_decompress_safe_partial_forceExtDict
                        (unaff_retaddr,
                         (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                         compressedSize_00,(int)in_RDI,iVar1,(void *)CONCAT44(in_EDX,in_ECX),
                         CONCAT44(dstCapacity,in_stack_00000010));
    }
  }
  return iVar1;
}

Assistant:

int LZ4_decompress_safe_partial_usingDict(const char* source, char* dest, int compressedSize, int targetOutputSize, int dstCapacity, const char* dictStart, int dictSize)
{
    if (dictSize==0)
        return LZ4_decompress_safe_partial(source, dest, compressedSize, targetOutputSize, dstCapacity);
    if (dictStart+dictSize == dest) {
        if (dictSize >= 64 KB - 1) {
            return LZ4_decompress_safe_partial_withPrefix64k(source, dest, compressedSize, targetOutputSize, dstCapacity);
        }
        assert(dictSize >= 0);
        return LZ4_decompress_safe_partial_withSmallPrefix(source, dest, compressedSize, targetOutputSize, dstCapacity, (size_t)dictSize);
    }
    assert(dictSize >= 0);
    return LZ4_decompress_safe_partial_forceExtDict(source, dest, compressedSize, targetOutputSize, dstCapacity, dictStart, (size_t)dictSize);
}